

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O0

int __thiscall deqp::egl::ImageTests::init(ImageTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *pEVar1;
  int iVar2;
  TestNode *node;
  TestCaseGroup *pTVar3;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  undefined1 local_6a;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  ImageTests *local_10;
  ImageTests *this_local;
  
  local_10 = this;
  node = (TestNode *)operator_new(0x78);
  local_6a = 1;
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"api",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"EGLImage API tests",&local_69);
  Image::ApiTests::ApiTests((ApiTests *)node,pEVar1,&local_30,&local_68);
  local_6a = 0;
  tcu::TestNode::addChild((TestNode *)this,node);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"create",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"EGLImage creation tests",&local_b9);
  pTVar3 = Image::createSimpleCreationTests(pEVar1,&local_90,&local_b8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"modify",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"EGLImage modifying tests",&local_109);
  pTVar3 = Image::createModifyTests(pEVar1,&local_e0,&local_108);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"render_multiple_contexts",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"EGLImage render tests on multiple contexts",&local_159);
  pTVar3 = Image::createMultiContextRenderTests(pEVar1,&local_130,&local_158);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  iVar2 = std::allocator<char>::~allocator(&local_131);
  return iVar2;
}

Assistant:

void ImageTests::init (void)
{
	addChild(new Image::ApiTests(m_eglTestCtx, "api", "EGLImage API tests"));
	addChild(Image::createSimpleCreationTests(m_eglTestCtx, "create", "EGLImage creation tests"));
	addChild(Image::createModifyTests(m_eglTestCtx, "modify", "EGLImage modifying tests"));
	addChild(Image::createMultiContextRenderTests(m_eglTestCtx, "render_multiple_contexts", "EGLImage render tests on multiple contexts"));
}